

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetGridAxisDescriptors
          (Gridded_Data_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
          *GADS)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pKVar4;
  GridAxisRegular *pGVar5;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_58;
  KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *local_50;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_48;
  KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *local_40;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_38;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  *GADS_local;
  Gridded_Data_PDU *this_local;
  
  citr._M_current = (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)GADS;
  citrEnd._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::begin(&this->m_vpGridAxisDesc);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
              *)&local_20,
             (__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
              *)&citrEnd);
  local_38._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::end(&this->m_vpGridAxisDesc);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
             ::operator*(&local_20);
    pGVar5 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::operator->(pKVar4);
    iVar2 = (*(pGVar5->super_DataTypeBase)._vptr_DataTypeBase[7])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength - (short)iVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ::operator=(&this->m_vpGridAxisDesc,
              (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
               *)citr._M_current);
  sVar3 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
          ::size(&this->m_vpGridAxisDesc);
  this->m_ui8NumAxis = (KUINT8)sVar3;
  local_48._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::begin(&this->m_vpGridAxisDesc);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
              *)&local_40,&local_48);
  local_20._M_current = local_40;
  local_58._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
       ::end(&this->m_vpGridAxisDesc);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>>>>
              *)&local_50,&local_58);
  local_30._M_current = local_50;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
             ::operator*(&local_20);
    pGVar5 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>::operator->(pKVar4);
    iVar2 = (*(pGVar5->super_DataTypeBase)._vptr_DataTypeBase[7])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + (short)iVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Gridded_Data_PDU::SetGridAxisDescriptors( const std::vector<GridAxisDescriptor> & GADS )
{
    // calculate length that needs to be removed.
    vector<GridAxisDescriptor>::const_iterator citr = m_vpGridAxisDesc.begin();
    vector<GridAxisDescriptor>::const_iterator citrEnd = m_vpGridAxisDesc.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= ( *citr )->GetLength();
    }

    m_vpGridAxisDesc = GADS;
    m_ui8NumAxis = m_vpGridAxisDesc.size();

    // Calculate the new PDU length.
    citr = m_vpGridAxisDesc.begin();
    citrEnd = m_vpGridAxisDesc.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetLength();
    }
}